

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valtype.h
# Opt level: O2

LatticeComparison __thiscall wasm::analysis::ValType::compare(ValType *this,Element a,Element b)

{
  char cVar1;
  byte bVar2;
  LatticeComparison LVar3;
  
  if (a.id == b.id) {
    LVar3 = EQUAL;
  }
  else {
    LVar3 = LESS;
    if ((b.id != 0) && (cVar1 = wasm::Type::isSubType((Type)a.id,(Type)b.id), cVar1 == '\0')) {
      if (a.id == 0) {
        LVar3 = GREATER;
      }
      else {
        bVar2 = wasm::Type::isSubType((Type)b.id,(Type)a.id);
        LVar3 = (uint)bVar2 + (uint)bVar2 * 2;
      }
    }
  }
  return LVar3;
}

Assistant:

LatticeComparison compare(Element a, Element b) const noexcept {
    if (a == b) {
      return EQUAL;
    }
    if (b == Type::none || Type::isSubType(a, b)) {
      return LESS;
    }
    if (a == Type::none || Type::isSubType(b, a)) {
      return GREATER;
    }
    return NO_RELATION;
  }